

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
Analyze(StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this,
       ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  bool bVar3;
  size_type __n;
  idx_t iVar4;
  ulong uVar5;
  reference rVar6;
  
  if (parent == (ColumnWriterState *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0
            || (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p !=
               (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
  }
  __n = (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1;
  if (bVar3) {
    count = ((long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1) - __n;
  }
  pdVar1 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 && !bVar3) {
    if (count != 0) {
      iVar4 = 0;
      do {
        PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::Insert
                  (*(PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                     **)(pdVar1 + iVar4 * 8),&state_p[2].definition_levels);
        state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (count != 0) {
    uVar5 = 0;
    do {
      if ((!bVar3) ||
         (rVar6 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
         (*rVar6._M_p & rVar6._M_mask) == 0)) {
        puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
          Insert(*(PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                   **)(pdVar1 + uVar5 * 8),&state_p[2].definition_levels);
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        }
        uVar5 = uVar5 + 1;
      }
      __n = __n + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}